

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyply.h
# Opt level: O2

bool __thiscall tinyply::PlyFile::PlyFileImpl::parse_header(PlyFileImpl *this,istream *is)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  istream *piVar2;
  PlyFileImpl *line_00;
  PlyFileImpl *pPVar3;
  istringstream local_258 [8];
  istringstream ls;
  undefined1 local_b8 [32];
  undefined1 local_98 [8];
  string line;
  string token;
  bool local_31;
  
  local_98 = (undefined1  [8])&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  token.field_2._8_8_ = &this->comments;
  local_31 = true;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (&line.field_2._M_allocated_capacity + 1);
  do {
    line_00 = (PlyFileImpl *)&stack0xffffffffffffff28;
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)local_98);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::istringstream::istringstream(local_258,(string *)local_98,_S_in);
    line.field_2._8_8_ = &token._M_string_length;
    token._M_dataplus._M_p = (pointer)0x0;
    token._M_string_length._0_1_ = 0;
    std::operator>>((istream *)local_258,(string *)__lhs);
    bVar1 = std::operator==(__lhs,"ply");
    if (((bVar1) || (bVar1 = std::operator==(__lhs,"PLY"), bVar1)) ||
       (bVar1 = std::operator==(__lhs,""), bVar1)) {
LAB_001154e2:
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==(__lhs,"comment");
      if (bVar1) {
        pPVar3 = line_00;
        std::__cxx11::string::string
                  ((string *)line_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        read_header_text(pPVar3,(string *)line_00,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)token.field_2._8_8_,8);
LAB_00115477:
        std::__cxx11::string::~string((string *)line_00);
        goto LAB_001154e2;
      }
      bVar1 = std::operator==(__lhs,"format");
      if (bVar1) {
        read_header_format(this,(istream *)local_258);
        goto LAB_001154e2;
      }
      bVar1 = std::operator==(__lhs,"element");
      if (bVar1) {
        std::vector<tinyply::PlyElement,std::allocator<tinyply::PlyElement>>::
        emplace_back<std::istream&>
                  ((vector<tinyply::PlyElement,std::allocator<tinyply::PlyElement>> *)
                   &this->elements,(basic_istream<char,_std::char_traits<char>_> *)local_258);
        goto LAB_001154e2;
      }
      bVar1 = std::operator==(__lhs,"property");
      if (bVar1) {
        read_header_property(this,(istream *)local_258);
        goto LAB_001154e2;
      }
      bVar1 = std::operator==(__lhs,"obj_info");
      if (bVar1) {
        pPVar3 = (PlyFileImpl *)local_b8;
        std::__cxx11::string::string
                  ((string *)pPVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        line_00 = (PlyFileImpl *)local_b8;
        read_header_text(pPVar3,(string *)line_00,&this->objInfo,9);
        goto LAB_00115477;
      }
      bVar1 = std::operator==(__lhs,"end_header");
      local_31 = (bool)(local_31 & bVar1);
    }
    std::__cxx11::string::~string((string *)__lhs);
    std::__cxx11::istringstream::~istringstream(local_258);
  } while (bVar1 == false);
  std::__cxx11::string::~string((string *)local_98);
  return local_31;
}

Assistant:

bool PlyFile::PlyFileImpl::parse_header(std::istream & is)
{
    std::string line;
    bool success = true;
    while (std::getline(is, line))
    {
        std::istringstream ls(line);
        std::string token;
        ls >> token;
        if (token == "ply" || token == "PLY" || token == "") continue;
        else if (token == "comment")    read_header_text(line, comments, 8);
        else if (token == "format")     read_header_format(ls);
        else if (token == "element")    read_header_element(ls);
        else if (token == "property")   read_header_property(ls);
        else if (token == "obj_info")   read_header_text(line, objInfo, 9);
        else if (token == "end_header") break;
        else success = false; // unexpected header field
    }
    return success;
}